

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O0

_Bool olsrv2_mpr_shall_process(rfc5444_reader_tlvblock_context *context,uint64_t vtime)

{
  uint8_t uVar1;
  oonf_log_source oVar2;
  undefined8 uVar3;
  char *pcVar4;
  bool local_b4;
  undefined1 local_b3 [8];
  netaddr_str buf;
  _Bool process;
  oonf_duplicate_result dup_result;
  uint64_t vtime_local;
  rfc5444_reader_tlvblock_context *context_local;
  
  unique0x10000152 = vtime;
  if (((context->has_origaddr & 1U) == 0) || ((context->has_seqno & 1U) == 0)) {
    if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
      oonf_log(1,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x192,0,0,
               "Do not process message type %u, originator or sequence number is missing!",
               context->msg_type);
    }
    context_local._7_1_ = false;
  }
  else {
    buf.buf._55_4_ =
         oonf_duplicate_entry_add
                   (&_protocol->processed_set,context->msg_type,&context->orig_addr,context->seqno,
                    vtime + _olsrv2_config.f_hold_time);
    oVar2 = LOG_OLSRV2;
    local_b4 = true;
    if ((buf.buf._55_4_ != 2) && (local_b4 = true, buf.buf._55_4_ != 4)) {
      local_b4 = buf.buf._55_4_ == 5;
    }
    buf.buf[0x36] = local_b4;
    if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
      pcVar4 = "not ";
      if (local_b4 != false) {
        pcVar4 = "";
      }
      uVar1 = context->msg_type;
      uVar3 = netaddr_to_prefixstring(local_b3,&context->orig_addr,0);
      oonf_log(1,oVar2,"src/olsrv2/olsrv2/olsrv2.c",0x19e,0,0,
               "Do %sprocess message type %u from %s with seqno %u (dupset result: %u)",pcVar4,uVar1
               ,uVar3,context->seqno,buf.buf._55_4_);
    }
    context_local._7_1_ = (_Bool)(buf.buf[0x36] & 1);
  }
  return context_local._7_1_;
}

Assistant:

bool
olsrv2_mpr_shall_process(struct rfc5444_reader_tlvblock_context *context, uint64_t vtime) {
  enum oonf_duplicate_result dup_result;
  bool process;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not process message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->processed_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  process = oonf_duplicate_is_new(dup_result);

  OONF_DEBUG(LOG_OLSRV2,
    "Do %sprocess message type %u from %s"
    " with seqno %u (dupset result: %u)",
    process ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
  return process;
}